

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

void __thiscall
LowererMDArch::EmitLoadVar(LowererMDArch *this,Instr *instrLoad,bool isFromUint32,bool isHelper)

{
  LowererMD *pLVar1;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  bool bVar5;
  Opnd *pOVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  RegOpnd *src;
  RegOpnd *pRVar9;
  RegOpnd *this_00;
  Instr *pIVar10;
  IntConstOpnd *newSrc;
  BranchInstr *pBVar11;
  LabelInstr *branchTarget;
  LabelInstr *labelDone;
  Instr *instr;
  RegOpnd *e1;
  RegOpnd *r1;
  LabelInstr *labelHelper;
  RegOpnd *src1;
  Opnd *dst;
  bool isInt;
  bool isHelper_local;
  bool isFromUint32_local;
  Instr *instrLoad_local;
  LowererMDArch *this_local;
  
  pOVar6 = IR::Instr::GetSrc1(instrLoad);
  bVar3 = IR::Opnd::IsRegOpnd(pOVar6);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x9d2,"(instrLoad->GetSrc1()->IsRegOpnd())",
                       "instrLoad->GetSrc1()->IsRegOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pOVar6 = IR::Instr::GetDst(instrLoad);
  IVar4 = IR::Opnd::GetType(pOVar6);
  if (IVar4 != TyVar) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x9d3,"(instrLoad->GetDst()->GetType() == TyVar)",
                       "instrLoad->GetDst()->GetType() == TyVar");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = false;
  pOVar6 = IR::Instr::GetDst(instrLoad);
  pOVar8 = IR::Instr::GetSrc1(instrLoad);
  src = IR::Opnd::AsRegOpnd(pOVar8);
  r1 = (RegOpnd *)0x0;
  IR::Opnd::SetType(&src->super_Opnd,TyInt32);
  bVar5 = IR::Opnd::IsTaggedInt(&src->super_Opnd);
  if (bVar5) {
    bVar3 = true;
  }
  else {
    bVar5 = IR::Opnd::IsNotInt(&src->super_Opnd);
    if (bVar5) {
      pLVar1 = this->lowererMD;
      pRVar9 = IR::Opnd::AsRegOpnd(pOVar6);
      LowererMD::EmitLoadVarNoCheck(pLVar1,pRVar9,src,instrLoad,isFromUint32,isHelper);
      return;
    }
  }
  pRVar9 = IR::RegOpnd::New(TyVar,this->m_func);
  pOVar8 = IR::Opnd::Copy(&pRVar9->super_Opnd,this->m_func);
  this_00 = IR::Opnd::AsRegOpnd(pOVar8);
  IR::Opnd::SetType(&this_00->super_Opnd,TyInt32);
  pIVar10 = IR::Instr::New(MOV_TRUNC,&this_00->super_Opnd,&src->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrLoad,pIVar10);
  if ((!bVar3) && (isFromUint32)) {
    pIVar10 = IR::Instr::New(CMP,this->m_func);
    IR::Instr::SetSrc1(pIVar10,&this_00->super_Opnd);
    newSrc = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
    IR::Instr::SetSrc2(pIVar10,&newSrc->super_Opnd);
    IR::Instr::InsertBefore(instrLoad,pIVar10);
    r1 = (RegOpnd *)IR::LabelInstr::New(Label,this->m_func,true);
    pBVar11 = IR::BranchInstr::New(JLT,(LabelInstr *)r1,this->m_func);
    IR::Instr::InsertBefore(instrLoad,&pBVar11->super_Instr);
  }
  LowererMD::GenerateInt32ToVarConversion(this->lowererMD,&pRVar9->super_Opnd,instrLoad);
  pIVar10 = IR::Instr::New(MOV,pOVar6,&pRVar9->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrLoad,pIVar10);
  if (r1 != (RegOpnd *)0x0) {
    if (!isFromUint32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0xa12,"(isFromUint32)","isFromUint32");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    branchTarget = IR::LabelInstr::New(Label,this->m_func,isHelper);
    pBVar11 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(instrLoad,&pBVar11->super_Instr);
    IR::Instr::InsertBefore(instrLoad,(Instr *)r1);
    pLVar1 = this->lowererMD;
    pRVar9 = IR::Opnd::AsRegOpnd(pOVar6);
    LowererMD::EmitLoadVarNoCheck(pLVar1,pRVar9,src,instrLoad,isFromUint32,true);
    IR::Instr::InsertBefore(instrLoad,&branchTarget->super_Instr);
  }
  IR::Instr::Remove(instrLoad);
  return;
}

Assistant:

void
LowererMDArch::EmitLoadVar(IR::Instr *instrLoad, bool isFromUint32, bool isHelper)
{
    //    MOV_TRUNC e1, e_src1
    //    CMP e1, 0             [uint32]
    //    JLT $Helper           [uint32]  -- overflows?
    //    BTS r1, VarTag_Shift
    //    MOV r_dst, r1
    //    JMP $done             [uint32]
    // $helper                  [uint32]
    //    EmitLoadVarNoCheck
    // $done                    [uint32]


    Assert(instrLoad->GetSrc1()->IsRegOpnd());
    Assert(instrLoad->GetDst()->GetType() == TyVar);

    bool isInt            = false;
    IR::Opnd *dst         = instrLoad->GetDst();
    IR::RegOpnd *src1     = instrLoad->GetSrc1()->AsRegOpnd();
    IR::LabelInstr *labelHelper = nullptr;

    // TODO: Fix bad lowering. We shouldn't get TyVars here.
    // Assert(instrLoad->GetSrc1()->GetType() == TyInt32);
    src1->SetType(TyInt32);

    if (src1->IsTaggedInt())
    {
        isInt = true;
    }
    else if (src1->IsNotInt())
    {
        // ToVar()
        this->lowererMD->EmitLoadVarNoCheck(dst->AsRegOpnd(), src1, instrLoad, isFromUint32, isHelper);
        return;
    }

    IR::RegOpnd *r1 = IR::RegOpnd::New(TyVar, m_func);

    // e1 = MOV_TRUNC e_src1
    // (Use MOV_TRUNC here as we rely on the register copy to clear the upper 32 bits.)
    IR::RegOpnd *e1 = r1->Copy(m_func)->AsRegOpnd();
    e1->SetType(TyInt32);
    instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV_TRUNC,
        e1,
        src1,
        m_func));

    if (!isInt && isFromUint32)
    {
        // CMP e1, 0
        IR::Instr *instr = IR::Instr::New(Js::OpCode::CMP, m_func);
        instr->SetSrc1(e1);
        instr->SetSrc2(IR::IntConstOpnd::New(0, TyInt32, m_func));
        instrLoad->InsertBefore(instr);

        Assert(!labelHelper);
        labelHelper = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);

        // JLT $helper
        instr = IR::BranchInstr::New(Js::OpCode::JLT, labelHelper, m_func);
        instrLoad->InsertBefore(instr);
    }

    // The previous operation clears the top 32 bits.
    // BTS r1, VarTag_Shift
    this->lowererMD->GenerateInt32ToVarConversion(r1, instrLoad);

    // REVIEW: We need r1 only if we could generate sn = Ld_A_I4 sn. i.e. the destination and
    // source are the same.
    // r_dst = MOV r1
    instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV,
        dst,
        r1,
        m_func));

    if (labelHelper)
    {
        Assert(isFromUint32);

        // JMP $done
        IR::LabelInstr * labelDone = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
        instrLoad->InsertBefore(IR::BranchInstr::New(Js::OpCode::JMP, labelDone, m_func));

        // $helper
        instrLoad->InsertBefore(labelHelper);

        // ToVar()
        this->lowererMD->EmitLoadVarNoCheck(dst->AsRegOpnd(), src1, instrLoad, isFromUint32, true);

        // $done
        instrLoad->InsertBefore(labelDone);
    }
    instrLoad->Remove();
}